

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

int skip_cost_update(SequenceHeader *seq_params,TileInfo *tile_info,int mi_row,int mi_col,
                    INTERNAL_COST_UPDATE_TYPE upd_level)

{
  int iVar1;
  int iVar2;
  int num_sb_rows_per_update;
  int num_rows_update_per_tile;
  int num_updates_per_tile;
  int update_freq_num_rows;
  int update_freq_sb_rows;
  int sb_size_update_freq_map [2];
  int tile_height;
  int sb_size;
  int sb_row;
  int mib_size_log2;
  INTERNAL_COST_UPDATE_TYPE upd_level_local;
  int mi_col_local;
  int mi_row_local;
  TileInfo *tile_info_local;
  SequenceHeader *seq_params_local;
  int local_4;
  
  if (upd_level == INTERNAL_COST_UPD_SB) {
    local_4 = 0;
  }
  else if (upd_level == INTERNAL_COST_UPD_OFF) {
    local_4 = 1;
  }
  else if (mi_col == tile_info->mi_col_start) {
    if (upd_level == INTERNAL_COST_UPD_SBROW_SET) {
      iVar1 = seq_params->mib_size * 4;
      iVar2 = (tile_info->mi_row_end - tile_info->mi_row_start) * 4;
      sb_size_update_freq_map[0] = 2;
      sb_size_update_freq_map[1] = 4;
      iVar1 = ((iVar2 + iVar1 * sb_size_update_freq_map[(int)(uint)(iVar1 != 0x80)] + -1) /
              (iVar1 * sb_size_update_freq_map[(int)(uint)(iVar1 != 0x80)])) * iVar1;
      if ((mi_row - tile_info->mi_row_start >> ((byte)seq_params->mib_size_log2 & 0x1f)) %
          ((iVar2 + iVar1 + -1) / iVar1) != 0) {
        return 1;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int skip_cost_update(const SequenceHeader *seq_params,
                            const TileInfo *const tile_info, const int mi_row,
                            const int mi_col,
                            INTERNAL_COST_UPDATE_TYPE upd_level) {
  if (upd_level == INTERNAL_COST_UPD_SB) return 0;
  if (upd_level == INTERNAL_COST_UPD_OFF) return 1;

  // upd_level is at most as frequent as each sb_row in a tile.
  if (mi_col != tile_info->mi_col_start) return 1;

  if (upd_level == INTERNAL_COST_UPD_SBROW_SET) {
    const int mib_size_log2 = seq_params->mib_size_log2;
    const int sb_row = (mi_row - tile_info->mi_row_start) >> mib_size_log2;
    const int sb_size = seq_params->mib_size * MI_SIZE;
    const int tile_height =
        (tile_info->mi_row_end - tile_info->mi_row_start) * MI_SIZE;
    // When upd_level = INTERNAL_COST_UPD_SBROW_SET, the cost update happens
    // once for 2, 4 sb rows for sb size 128, sb size 64 respectively. However,
    // as the update will not be equally spaced in smaller resolutions making
    // it equally spaced by calculating (mv_num_rows_cost_update) the number of
    // rows after which the cost update should happen.
    const int sb_size_update_freq_map[2] = { 2, 4 };
    const int update_freq_sb_rows =
        sb_size_update_freq_map[sb_size != MAX_SB_SIZE];
    const int update_freq_num_rows = sb_size * update_freq_sb_rows;
    // Round-up the division result to next integer.
    const int num_updates_per_tile =
        (tile_height + update_freq_num_rows - 1) / update_freq_num_rows;
    const int num_rows_update_per_tile = num_updates_per_tile * sb_size;
    // Round-up the division result to next integer.
    const int num_sb_rows_per_update =
        (tile_height + num_rows_update_per_tile - 1) / num_rows_update_per_tile;
    if ((sb_row % num_sb_rows_per_update) != 0) return 1;
  }
  return 0;
}